

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O1

int dwarf_get_macro_defundef
              (Dwarf_Macro_Context macro_context,Dwarf_Unsigned op_number,
              Dwarf_Unsigned *line_number,Dwarf_Unsigned *index,Dwarf_Unsigned *offset,
              Dwarf_Half *forms_count,char **macro_string,Dwarf_Error *error)

{
  byte bVar1;
  Dwarf_Macro_Operator_s *pDVar2;
  Dwarf_Unsigned *pDVar3;
  int iVar4;
  Dwarf_Unsigned DVar5;
  char *pcVar6;
  Dwarf_Error pDVar7;
  Dwarf_Signed errval;
  uint uVar8;
  Dwarf_Unsigned offset_00;
  Dwarf_Small *pDVar9;
  Dwarf_Debug dbg;
  Dwarf_Unsigned lu_local_1;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Unsigned lu_local_3;
  Dwarf_Error local_80;
  Dwarf_Unsigned *local_78;
  undefined4 local_6c;
  Dwarf_Small *local_68;
  Dwarf_Unsigned local_60;
  Dwarf_Error local_58;
  Dwarf_Small *local_50;
  uint local_44;
  Dwarf_Unsigned *local_40;
  Dwarf_Unsigned local_38;
  
  if (macro_context == (Dwarf_Macro_Context)0x0) {
    dbg = (Dwarf_Debug)0x0;
LAB_00179622:
    _dwarf_error_string(dbg,error,0x142,
                        "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
    return 1;
  }
  dbg = macro_context->mc_dbg;
  if (macro_context->mc_sentinel != 0xada) goto LAB_00179622;
  if (macro_context->mc_macro_ops_count <= op_number) {
    errval = 0x143;
    goto LAB_00179654;
  }
  pDVar2 = macro_context->mc_ops;
  if ((pDVar2[op_number].mo_form)->mf_formcount != '\x02') {
    return -1;
  }
  uVar8 = (uint)pDVar2[op_number].mo_opcode;
  local_78 = index;
  if (0xb < uVar8 - 1) {
switchD_001795c6_caseD_3:
    errval = 0x144;
LAB_00179654:
    _dwarf_error(dbg,error,errval);
    return 1;
  }
  local_68 = macro_context->mc_macro_header;
  local_50 = local_68 + macro_context->mc_total_length;
  pDVar9 = pDVar2[op_number].mo_data;
  local_6c = 2;
  local_40 = offset;
  switch(uVar8) {
  case 1:
  case 2:
    local_58 = (Dwarf_Error)0x0;
    local_80 = (Dwarf_Error)0x0;
    iVar4 = dwarf_decode_leb128((char *)pDVar9,(Dwarf_Unsigned *)&local_58,
                                (Dwarf_Unsigned *)&local_80,(char *)local_50);
    pDVar3 = local_78;
    pDVar7 = local_80;
    if (iVar4 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
      return 1;
    }
    pDVar9 = pDVar9 + (long)local_58;
    iVar4 = _dwarf_check_string_valid(dbg,local_68,pDVar9,local_50,0x16e,error);
    if (iVar4 != 0) {
      return iVar4;
    }
    *line_number = (Dwarf_Unsigned)pDVar7;
    *pDVar3 = 0;
    *local_40 = 0;
    *forms_count = (Dwarf_Half)local_6c;
    *macro_string = (char *)pDVar9;
    return 0;
  default:
    goto switchD_001795c6_caseD_3;
  case 5:
  case 6:
    local_44 = (uint)(pDVar2[op_number].mo_form)->mf_formbytes[1];
    local_58 = (Dwarf_Error)0x0;
    local_80 = (Dwarf_Error)0x0;
    local_60 = 0;
    local_68 = pDVar9;
    iVar4 = dwarf_decode_leb128((char *)pDVar9,(Dwarf_Unsigned *)&local_80,&local_60,
                                (char *)local_50);
    if (iVar4 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
      return 1;
    }
    pDVar9 = local_68 + (long)local_80;
    local_80 = (Dwarf_Error)0x0;
    bVar1 = macro_context->mc_offset_size;
    local_68 = (Dwarf_Small *)local_60;
    if (local_50 < pDVar9 + bVar1) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      pDVar7 = (Dwarf_Error)0x0;
    }
    else {
      (*dbg->de_copy_word)(&local_80,pDVar9,(ulong)bVar1);
      pDVar7 = local_80;
    }
    pDVar3 = local_78;
    if (local_50 < pDVar9 + bVar1) {
      return 1;
    }
    iVar4 = _dwarf_extract_local_debug_str_string_given_offset
                      (dbg,local_44,(Dwarf_Unsigned)pDVar7,(char **)&local_58,error);
    *pDVar3 = 0;
    *line_number = (Dwarf_Unsigned)local_68;
    *local_40 = (Dwarf_Unsigned)pDVar7;
    *forms_count = (Dwarf_Half)local_6c;
    if (iVar4 == -1) {
      iVar4 = 0;
      local_58 = (Dwarf_Error)0x1b1080;
    }
    else if (iVar4 == 1) {
      local_58 = (Dwarf_Error)0x1b105e;
      iVar4 = 1;
    }
    else {
      iVar4 = 0;
    }
    break;
  case 8:
  case 9:
    local_58 = (Dwarf_Error)0x0;
    local_80 = (Dwarf_Error)0x0;
    local_60 = 0;
    local_38 = 0;
    iVar4 = dwarf_decode_leb128((char *)pDVar9,&local_60,&local_38,(char *)local_50);
    DVar5 = local_38;
    if (iVar4 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
      return 1;
    }
    pDVar9 = pDVar9 + local_60;
    local_60 = 0;
    bVar1 = macro_context->mc_offset_size;
    if (local_50 < pDVar9 + bVar1) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      offset_00 = 0;
    }
    else {
      (*dbg->de_copy_word)(&local_60,pDVar9,(ulong)bVar1);
      offset_00 = local_60;
    }
    if (local_50 < pDVar9 + bVar1) {
      return 1;
    }
    *line_number = DVar5;
    *local_78 = 0;
    *local_40 = offset_00;
    *forms_count = (Dwarf_Half)local_6c;
    iVar4 = _dwarf_get_string_from_tied(dbg,offset_00,(char **)&local_58,&local_80);
    if (iVar4 == 0) goto LAB_00179b98;
    if (iVar4 == 1) {
      DVar5 = dwarf_errno(local_80);
      if ((DVar5 & 0xffffffff) == 0x134) {
        pcVar6 = "<DW_FORM_str_sup-no-tied_file>";
      }
      else {
        _dwarf_error(dbg,error,DVar5 & 0xffffffff);
        pcVar6 = "<Error: DW_FORM_str_sup-got-error>";
      }
      *macro_string = pcVar6;
      dwarf_dealloc(dbg,local_80,0xe);
      return 1;
    }
    local_58 = (Dwarf_Error)0x1b1126;
    break;
  case 0xb:
  case 0xc:
    local_58 = (Dwarf_Error)0x0;
    local_44 = (uint)(pDVar2[op_number].mo_form)->mf_formbytes[1];
    local_80 = (Dwarf_Error)0x0;
    local_60 = 0;
    local_68 = pDVar9;
    iVar4 = dwarf_decode_leb128((char *)pDVar9,(Dwarf_Unsigned *)&local_80,&local_60,
                                (char *)local_50);
    if (iVar4 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
      return 1;
    }
    pDVar9 = local_68 + (long)local_80;
    *line_number = local_60;
    local_80 = (Dwarf_Error)0x0;
    local_60 = 0;
    iVar4 = dwarf_decode_leb128((char *)pDVar9,(Dwarf_Unsigned *)&local_80,&local_60,
                                (char *)local_50);
    pDVar3 = local_78;
    if (iVar4 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
      return 1;
    }
    *local_78 = local_60;
    *forms_count = (Dwarf_Half)local_6c;
    uVar8 = local_44 & 0xffff;
    local_78 = (Dwarf_Unsigned *)local_60;
    iVar4 = _dwarf_extract_string_offset_via_str_offsets
                      (dbg,pDVar9 + (long)local_80,local_50,(Dwarf_Half)local_44,
                       macro_context->mc_cu_context,(Dwarf_Unsigned *)&local_58,error);
    if (iVar4 == 1) {
      return 1;
    }
    if (iVar4 == 0) {
      local_80 = (Dwarf_Error)0x0;
      *pDVar3 = (Dwarf_Unsigned)local_78;
      *local_40 = (Dwarf_Unsigned)local_58;
      iVar4 = _dwarf_extract_local_debug_str_string_given_offset
                        (dbg,uVar8,(Dwarf_Unsigned)local_58,(char **)&local_80,error);
      if (iVar4 == 1) {
        return 1;
      }
      local_58 = local_80;
      if (iVar4 == -1) {
        local_58 = (Dwarf_Error)"<:No string available>";
      }
    }
    else {
      *pDVar3 = (Dwarf_Unsigned)local_78;
      *local_40 = 0;
      local_58 = (Dwarf_Error)"<.debug_str_offsets not available>";
    }
LAB_00179b98:
    *macro_string = (char *)local_58;
    return 0;
  }
  *macro_string = (char *)local_58;
  return iVar4;
}

Assistant:

int
dwarf_get_macro_defundef(Dwarf_Macro_Context macro_context,
    Dwarf_Unsigned op_number,
    Dwarf_Unsigned * line_number,
    Dwarf_Unsigned * index,
    Dwarf_Unsigned * offset,
    Dwarf_Half     * forms_count,
    const char     ** macro_string,
    Dwarf_Error *error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Small *mdata = 0;
    int res = 0;
    Dwarf_Small *startptr = 0;
    Dwarf_Small *endptr = 0;
    Dwarf_Half lformscount = 0;
    struct Dwarf_Macro_Operator_s *curop = 0;
    unsigned macop = 0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    dbg = macro_context->mc_dbg;
    if (op_number >= macro_context->mc_macro_ops_count) {
        _dwarf_error(dbg, error,DW_DLE_BAD_MACRO_INDEX);
        return DW_DLV_ERROR;
    }
    curop = macro_context->mc_ops + op_number;
    macop = curop->mo_opcode;
    startptr = macro_context->mc_macro_header;
    endptr = startptr + macro_context->mc_total_length;
    mdata = curop->mo_data;
    lformscount = curop->mo_form->mf_formcount;
    if (lformscount != 2) {
        /*_dwarf_error(dbg, error,DW_DLE_MACRO_OPCODE_FORM_BAD);*/
        return DW_DLV_NO_ENTRY;
    }
    switch(macop){
    case DW_MACRO_define:
    case DW_MACRO_undef: {
        Dwarf_Unsigned linenum = 0;
        const char * content = 0;

        DECODE_LEB128_UWORD_CK(mdata,linenum,
            dbg, error,endptr);
        content = (const char *)mdata;
        res = _dwarf_check_string_valid(dbg,
            startptr,mdata, endptr,
            DW_DLE_MACRO_STRING_BAD,error);
        if (res != DW_DLV_OK) {
            return res;
        }
        *line_number = linenum;
        *index = 0;
        *offset = 0;
        *forms_count = lformscount;
        *macro_string = content;
        }
        return DW_DLV_OK;
    case DW_MACRO_define_strp:
    case DW_MACRO_undef_strp: {
        Dwarf_Unsigned linenum = 0;
        Dwarf_Unsigned stringoffset = 0;
        Dwarf_Small form1 =  curop->mo_form->mf_formbytes[1];
        char * localstr = 0;

        DECODE_LEB128_UWORD_CK(mdata,linenum,
            dbg, error,endptr);
        READ_UNALIGNED_CK(dbg,stringoffset,Dwarf_Unsigned,
            mdata,macro_context->mc_offset_size,
            error,endptr);
        res = _dwarf_extract_local_debug_str_string_given_offset(dbg,
            form1,
            stringoffset,
            &localstr,
            error);
        *index = 0;
        *line_number = linenum;
        *offset = stringoffset;
        *forms_count = lformscount;
        if (res == DW_DLV_ERROR) {
            *macro_string = "<Error: getting local .debug_str>";
            return res;
        } else if (res == DW_DLV_NO_ENTRY) {
            *macro_string = "<Error: NO_ENTRY on "
                ".debug_string (strp)>";
        } else {
            *macro_string = (const char *)localstr;
        }
        }
        return DW_DLV_OK;
    case DW_MACRO_define_strx:
    case DW_MACRO_undef_strx: {
        Dwarf_Unsigned linenum = 0;
        Dwarf_Unsigned stringindex = 0;
        Dwarf_Unsigned offsettostr= 0;
        int ress = 0;
        Dwarf_Byte_Ptr mdata_copy = 0;
        Dwarf_Small form1 =  curop->mo_form->mf_formbytes[1];

        DECODE_LEB128_UWORD_CK(mdata,linenum, dbg, error,endptr);
        *line_number = linenum;
        mdata_copy = mdata;
        DECODE_LEB128_UWORD_CK(mdata_copy,stringindex,
            dbg, error,endptr);
        /* mdata_copy is for call below */

        *index = stringindex;
        *forms_count = lformscount;

        /* Redoes the index-getting. Gets offset. */
        ress = _dwarf_extract_string_offset_via_str_offsets(dbg,
            mdata_copy,
            endptr,
            form1,
            macro_context->mc_cu_context,
            &offsettostr,
            error);
        if (ress  == DW_DLV_ERROR) {
            return ress;
        }
        if (ress == DW_DLV_OK) {
            char *localstr = 0;

            *index = stringindex;
            *offset = offsettostr;
            ress =
                _dwarf_extract_local_debug_str_string_given_offset(
                dbg,
                form1,
                offsettostr,
                &localstr,
                error);
            if (ress == DW_DLV_ERROR) {
                return ress;
            } else if (ress == DW_DLV_NO_ENTRY){
                *macro_string = "<:No string available>";
            } else {
                *macro_string = (const char *)localstr;
                /* All is ok. */
            }
        } else {
            *index = stringindex;
            *offset = 0;
            *macro_string = "<.debug_str_offsets not available>";
        }
        }
        return DW_DLV_OK;
    case DW_MACRO_define_sup:
    case DW_MACRO_undef_sup: {
        Dwarf_Unsigned linenum = 0;
        Dwarf_Unsigned supoffset = 0;
        char *localstring = 0;
        int resup = 0;
        Dwarf_Error lerr = 0;

        DECODE_LEB128_UWORD_CK(mdata,linenum,
            dbg, error,endptr);
        READ_UNALIGNED_CK(dbg,supoffset,Dwarf_Unsigned,
            mdata,macro_context->mc_offset_size,
            error,endptr);
        *line_number = linenum;
        *index = 0;
        *offset = supoffset;
        *forms_count = lformscount;
        resup = _dwarf_get_string_from_tied(dbg, supoffset,
            &localstring, &lerr);
        if (resup != DW_DLV_OK) {
            if (resup == DW_DLV_ERROR) {
                Dwarf_Unsigned myerrno =
                    (unsigned int)dwarf_errno(lerr);
                if (myerrno == DW_DLE_NO_TIED_FILE_AVAILABLE) {
                    *macro_string =
                        (char *)"<DW_FORM_str_sup-no-tied_file>";
                } else {
                    _dwarf_error(dbg,error,myerrno);
                    *macro_string =
                        (char *)"<Error: DW_FORM_str_sup-got-error>";
                }
                dwarf_dealloc(dbg,lerr,DW_DLA_ERROR);
            } else {
                *macro_string = "<DW_FORM_str_sup-no-entry>";
            }
            return resup;
        }
        *macro_string = (const char *)localstring;
        /*  If NO ENTRY available, return DW_DLV_NO_ENTRY.
            We suspect this is better than DW_DLV_OK.  */
        return resup;
        }
    default:
        _dwarf_error(dbg,error,DW_DLE_MACRO_OP_UNHANDLED);
        return DW_DLV_ERROR;
    }
    return DW_DLV_NO_ENTRY;
}